

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain.hpp
# Opt level: O0

void __thiscall
so_5::mchain_props::details::receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_>::
handle_next(receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_> *this,
           duration_t empty_timeout)

{
  bool bVar1;
  extraction_status_t eVar2;
  mchain_t *this_00;
  abstract_message_chain_t *paVar3;
  chain_closed_handler *this_01;
  receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_> *extraout_RDX;
  anon_class_16_2_7f447b8b lambda;
  chain_closed_handler *handler;
  bool handled;
  undefined1 local_30 [8];
  demand_t extracted_demand;
  receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_> *this_local;
  duration_t empty_timeout_local;
  
  extracted_demand._16_8_ = this;
  mchain_props::demand_t::demand_t((demand_t *)local_30);
  this_00 = mchain_receive_params_t::chain(this->m_params);
  paVar3 = intrusive_ptr_t<so_5::abstract_message_chain_t>::operator->(this_00);
  eVar2 = (*(paVar3->super_abstract_message_box_t)._vptr_abstract_message_box_t[0xc])
                    (paVar3,local_30,empty_timeout.__r);
  this->m_status = eVar2;
  if (this->m_status == msg_extracted) {
    this->m_extracted_messages = this->m_extracted_messages + 1;
    bVar1 = so_5::details::handlers_bunch_t<1UL>::handle
                      (this->m_bunch,(type_index *)local_30,(message_ref_t *)&extracted_demand,
                       (invocation_type_t)extracted_demand.m_message_ref.m_obj);
    if (bVar1) {
      this->m_handled_messages = this->m_handled_messages + 1;
    }
  }
  else if (this->m_status == chain_closed) {
    this_01 = mchain_bulk_processing_params_t<so_5::mchain_receive_params_t>::closed_handler
                        (&this->m_params->
                          super_mchain_bulk_processing_params_t<so_5::mchain_receive_params_t>);
    bVar1 = std::function::operator_cast_to_bool((function *)this_01);
    if (bVar1) {
      lambda.this = extraout_RDX;
      lambda.handler = (chain_closed_handler *)this;
      so_5::details::
      invoke_noexcept_code<so_5::mchain_props::details::receive_actions_performer_t<so_5::details::handlers_bunch_t<1ul>>::handle_next(std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                ((details *)this_01,lambda);
    }
  }
  mchain_props::demand_t::~demand_t((demand_t *)local_30);
  return;
}

Assistant:

void
		handle_next( duration_t empty_timeout )
			{
				demand_t extracted_demand;
				m_status = m_params.chain()->extract(
						extracted_demand, empty_timeout );

				if( extraction_status_t::msg_extracted == m_status )
					{
						++m_extracted_messages;
						const bool handled = m_bunch.handle(
								extracted_demand.m_msg_type,
								extracted_demand.m_message_ref,
								extracted_demand.m_demand_type );
						if( handled )
							++m_handled_messages;
					}
				// Since v.5.5.17 we must check presence of chain-closed handler.
				// This handler must be used if chain is closed.
				else if( extraction_status_t::chain_closed == m_status )
					{
						if( const auto & handler = m_params.closed_handler() )
							so_5::details::invoke_noexcept_code(
								[&handler, this] {
									handler( m_params.chain() );
								} );
					}
			}